

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::RgbaOutputFile::ToYca::ToYca(ToYca *this,OutputFile *outputFile,RgbaChannels rgbaChannels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  LineOrder LVar4;
  Header *pHVar5;
  Box2i *pBVar6;
  LineOrder *pLVar7;
  ulong uVar8;
  Rgba *pRVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined8 local_38;
  float local_30;
  
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->_outputFile = outputFile;
  this->_writeY = (bool)((byte)(rgbaChannels >> 4) & 1);
  this->_writeC = (bool)((byte)rgbaChannels >> 5 & 1);
  this->_writeA = (bool)((byte)rgbaChannels >> 3 & 1);
  pHVar5 = OutputFile::header(outputFile);
  pBVar6 = Header::dataWindow(pHVar5);
  iVar1 = (pBVar6->min).x;
  iVar2 = (pBVar6->min).y;
  iVar3 = (pBVar6->max).x;
  iVar11 = (pBVar6->max).y;
  this->_xMin = iVar1;
  this->_width = (iVar3 - iVar1) + 1;
  this->_height = (iVar11 - iVar2) + 1;
  this->_linesConverted = 0;
  pHVar5 = OutputFile::header(this->_outputFile);
  pLVar7 = Header::lineOrder(pHVar5);
  LVar4 = *pLVar7;
  this->_lineOrder = LVar4;
  if (LVar4 == INCREASING_Y) {
    iVar11 = iVar2;
  }
  this->_currentScanLine = iVar11;
  pHVar5 = OutputFile::header(this->_outputFile);
  anon_unknown_1::ywFromHeader((anon_unknown_1 *)&local_38,pHVar5);
  (this->_yw).x = (float)(undefined4)local_38;
  (this->_yw).y = (float)local_38._4_4_;
  (this->_yw).z = local_30;
  iVar1 = this->_width;
  lVar13 = (long)iVar1;
  uVar8 = anon_unknown_1::cachePadding(lVar13 * 8);
  lVar12 = (uVar8 >> 3) + lVar13;
  lVar10 = 0;
  pRVar9 = (Rgba *)operator_new__(-(ulong)((ulong)(lVar12 * 0x1b) >> 0x3d != 0) | lVar12 * 0xd8);
  this->_bufBase = pRVar9;
  do {
    this->_buf[lVar10] = pRVar9;
    lVar10 = lVar10 + 1;
    pRVar9 = pRVar9 + lVar12;
  } while (lVar10 != 0x1b);
  uVar8 = 0xffffffffffffffff;
  if (-0x1b < iVar1) {
    uVar8 = lVar13 * 8 + 0xd0;
  }
  pRVar9 = (Rgba *)operator_new__(uVar8);
  this->_tmpBuf = pRVar9;
  this->_fbBase = (Rgba *)0x0;
  this->_fbXStride = 0;
  this->_fbYStride = 0;
  this->_roundY = 7;
  this->_roundC = 5;
  return;
}

Assistant:

RgbaOutputFile::ToYca::ToYca (OutputFile& outputFile, RgbaChannels rgbaChannels)
    : _outputFile (outputFile)
{
    _writeY = (rgbaChannels & WRITE_Y) ? true : false;
    _writeC = (rgbaChannels & WRITE_C) ? true : false;
    _writeA = (rgbaChannels & WRITE_A) ? true : false;

    const Box2i dw = _outputFile.header ().dataWindow ();

    _xMin   = dw.min.x;
    _width  = dw.max.x - dw.min.x + 1;
    _height = dw.max.y - dw.min.y + 1;

    _linesConverted = 0;
    _lineOrder      = _outputFile.header ().lineOrder ();

    if (_lineOrder == INCREASING_Y)
        _currentScanLine = dw.min.y;
    else
        _currentScanLine = dw.max.y;

    _yw = ywFromHeader (_outputFile.header ());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * N];

    for (int i = 0; i < N; ++i)
        _buf[i] = _bufBase + (i * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase    = 0;
    _fbXStride = 0;
    _fbYStride = 0;

    _roundY = 7;
    _roundC = 5;
}